

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::Compiler::is_hidden_variable
          (Compiler *this,SPIRVariable *var,bool include_builtins)

{
  CombinedImageSampler *pCVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  __node_base_ptr p_Var5;
  CombinedImageSampler *pCVar6;
  CombinedImageSampler *pCVar7;
  long lVar8;
  key_type local_1c;
  
  bVar3 = is_builtin_variable(this,var);
  if (bVar3 && !include_builtins) {
    return true;
  }
  if (var->remapped_variable != false) {
    return true;
  }
  pCVar7 = (this->combined_image_samplers).
           super_VectorView<diligent_spirv_cross::CombinedImageSampler>.ptr;
  sVar2 = (this->combined_image_samplers).
          super_VectorView<diligent_spirv_cross::CombinedImageSampler>.buffer_size;
  pCVar1 = pCVar7 + sVar2;
  lVar8 = (long)sVar2 >> 2;
  pCVar6 = pCVar7;
  if (0 < lVar8) {
    uVar4 = (var->super_IVariant).self.id;
    pCVar6 = pCVar7 + lVar8 * 4;
    lVar8 = lVar8 + 1;
    pCVar7 = pCVar7 + 2;
    do {
      if (pCVar7[-2].combined_id.id == uVar4) {
        pCVar7 = pCVar7 + -2;
        goto LAB_00328ec4;
      }
      if (pCVar7[-1].combined_id.id == uVar4) {
        pCVar7 = pCVar7 + -1;
        goto LAB_00328ec4;
      }
      if ((pCVar7->combined_id).id == uVar4) goto LAB_00328ec4;
      if (pCVar7[1].combined_id.id == uVar4) {
        pCVar7 = pCVar7 + 1;
        goto LAB_00328ec4;
      }
      lVar8 = lVar8 + -1;
      pCVar7 = pCVar7 + 4;
    } while (1 < lVar8);
  }
  lVar8 = ((long)pCVar1 - (long)pCVar6 >> 2) * -0x5555555555555555;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      pCVar7 = pCVar1;
      if ((lVar8 != 3) ||
         (pCVar7 = pCVar6, (pCVar6->combined_id).id == (var->super_IVariant).self.id))
      goto LAB_00328ec4;
      pCVar6 = pCVar6 + 1;
    }
    pCVar7 = pCVar6;
    if ((pCVar6->combined_id).id == (var->super_IVariant).self.id) goto LAB_00328ec4;
    pCVar6 = pCVar6 + 1;
  }
  pCVar7 = pCVar6;
  if ((pCVar6->combined_id).id != (var->super_IVariant).self.id) {
    pCVar7 = pCVar1;
  }
LAB_00328ec4:
  if (pCVar7 == pCVar1) {
    uVar4 = ParsedIR::get_spirv_version(&this->ir);
    if (((0x103ff < uVar4) && (1 < var->storage - Function)) &&
       (bVar3 = interface_variable_exists_in_entry_point(this,(var->super_IVariant).self.id), !bVar3
       )) {
      return true;
    }
    if (this->check_active_interface_variables == true) {
      if (StorageBuffer < var->storage) {
        return false;
      }
      if ((0x160fU >> (var->storage & 0x1f) & 1) == 0) {
        return false;
      }
      local_1c.id = (var->super_IVariant).self.id;
      p_Var5 = ::std::
               _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::_M_find_before_node
                         (&(this->active_interface_variables)._M_h,
                          (ulong)local_1c.id %
                          (this->active_interface_variables)._M_h._M_bucket_count,&local_1c,
                          (ulong)local_1c.id);
      if (p_Var5 != (__node_base_ptr)0x0) {
        return p_Var5->_M_nxt == (_Hash_node_base *)0x0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Compiler::is_hidden_variable(const SPIRVariable &var, bool include_builtins) const
{
	if ((is_builtin_variable(var) && !include_builtins) || var.remapped_variable)
		return true;

	// Combined image samplers are always considered active as they are "magic" variables.
	if (find_if(begin(combined_image_samplers), end(combined_image_samplers), [&var](const CombinedImageSampler &samp) {
		    return samp.combined_id == var.self;
	    }) != end(combined_image_samplers))
	{
		return false;
	}

	// In SPIR-V 1.4 and up we must also use the active variable interface to disable global variables
	// which are not part of the entry point.
	if (ir.get_spirv_version() >= 0x10400 && var.storage != spv::StorageClassGeneric &&
	    var.storage != spv::StorageClassFunction && !interface_variable_exists_in_entry_point(var.self))
	{
		return true;
	}

	return check_active_interface_variables && storage_class_is_interface(var.storage) &&
	       active_interface_variables.find(var.self) == end(active_interface_variables);
}